

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void * __thiscall
adios2::format::BP5Deserializer::GetMetadataBase
          (BP5Deserializer *this,BP5VarRec *VarRec,size_t Step,size_t WriterRank)

{
  value_type pCVar1;
  value_type vVar2;
  value_type pvVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference ppCVar7;
  reference pvVar8;
  const_reference ppvVar9;
  reference ppvVar10;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  size_t MetadataFieldOffset;
  BP5MetadataInfoStruct *BaseData;
  size_t CI_VarIndex;
  ControlInfo *CI;
  MetaArrayRec *writer_meta_base;
  void *local_30;
  void *local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x17),
                        in_RCX);
    if (*pvVar8 == 0) {
      return (void *)0x0;
    }
    ppvVar10 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)in_RDI[0x1c],in_RCX);
    pvVar3 = *ppvVar10;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x17),
                        in_RCX);
    local_30 = (void *)((long)pvVar3 + *pvVar8);
LAB_00cfe461:
    local_8 = local_30;
  }
  else {
    sVar5 = std::
            vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
            ::size((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                    *)(in_RDI + 0x1e));
    if (in_RDX < sVar5) {
      pvVar6 = std::
               vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
               ::operator[]((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                             *)(in_RDI + 0x1e),in_RDX);
      sVar5 = std::
              vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>
              ::size(pvVar6);
      if (in_RCX < sVar5) {
        pvVar6 = std::
                 vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                 ::operator[]((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                               *)(in_RDI + 0x1e),in_RDX);
        ppCVar7 = std::
                  vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>
                  ::operator[](pvVar6,in_RCX);
        pCVar1 = *ppCVar7;
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (pCVar1->MetaFieldOffset);
        if ((sVar5 <= *in_RSI) ||
           (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pCVar1->MetaFieldOffset,*in_RSI), *pvVar8 == 0)) {
          return (void *)0x0;
        }
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pCVar1->CIVarIndex,*in_RSI);
        vVar2 = *pvVar8;
        ppvVar9 = std::
                  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                  ::operator[]((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                                *)(in_RDI + 0x21),in_RDX);
        ppvVar10 = std::vector<void_*,_std::allocator<void_*>_>::operator[](*ppvVar9,in_RCX);
        iVar4 = BP5Base::BP5BitfieldTest
                          ((BP5Base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),
                           (BP5MetadataInfoStruct *)*ppvVar10,(int)vVar2);
        if (iVar4 == 0) {
          return (void *)0x0;
        }
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pCVar1->MetaFieldOffset,*in_RSI);
        vVar2 = *pvVar8;
        ppvVar9 = std::
                  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                  ::operator[]((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                                *)(in_RDI + 0x21),in_RDX);
        ppvVar10 = std::vector<void_*,_std::allocator<void_*>_>::operator[](*ppvVar9,in_RCX);
        local_30 = (void *)((long)*ppvVar10 + vVar2);
        goto LAB_00cfe461;
      }
    }
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *BP5Deserializer::GetMetadataBase(BP5VarRec *VarRec, size_t Step, size_t WriterRank) const
{
    MetaArrayRec *writer_meta_base = NULL;
    if (m_RandomAccessMode)
    {
        if (Step >= m_ControlArray.size() || WriterRank >= m_ControlArray[Step].size())
        {
            return NULL; // we don't have this rank in this step
        }
        ControlInfo *CI = m_ControlArray[Step][WriterRank]; // writer control array
        if (((*CI->MetaFieldOffset).size() <= VarRec->VarNum) ||
            ((*CI->MetaFieldOffset)[VarRec->VarNum] == 0))
        {
            // Var does not appear in this record
            return NULL;
        }
        size_t CI_VarIndex = (*CI->CIVarIndex)[VarRec->VarNum];
        BP5MetadataInfoStruct *BaseData =
            (BP5MetadataInfoStruct *)(*MetadataBaseArray[Step])[WriterRank];
        if (!BP5BitfieldTest(BaseData, (int)CI_VarIndex))
        {
            // Var appears in CI, but wasn't written on this step
            return NULL;
        }
        size_t MetadataFieldOffset = (*CI->MetaFieldOffset)[VarRec->VarNum];
        writer_meta_base = (MetaArrayRec *)(((char *)(*MetadataBaseArray[Step])[WriterRank]) +
                                            MetadataFieldOffset);
    }
    else
    {
        if (VarRec->PerWriterMetaFieldOffset[WriterRank] == 0)
        {
            // Writer didn't write this var
            return NULL;
        }
        writer_meta_base = (MetaArrayRec *)(((char *)(*m_MetadataBaseAddrs)[WriterRank]) +
                                            VarRec->PerWriterMetaFieldOffset[WriterRank]);
    }
    return writer_meta_base;
}